

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t do_unpack(archive_read *a,rar5 *rar,void **buf,size_t *size,int64_t *offset)

{
  wchar_t wVar1;
  int64_t *offset_local;
  size_t *size_local;
  void **buf_local;
  rar5 *rar_local;
  archive_read *a_local;
  
  if (((byte)(rar->file).field_0x20 >> 1 & 1) == 0) {
    wVar1 = (rar->cstate).method;
    if (wVar1 == L'\0') {
      a_local._4_4_ = do_unstore_file(a,rar,buf,size,offset);
    }
    else if ((uint)(wVar1 + L'\xffffffff') < 5) {
      if (offset != (int64_t *)0x0) {
        *offset = (rar->cstate).last_write_ptr;
      }
      a_local._4_4_ = uncompress_file(a);
    }
    else {
      archive_set_error(&a->archive,0x54,"Compression method not supported: 0x%x",
                        (ulong)(uint)(rar->cstate).method);
      a_local._4_4_ = L'\xffffffe2';
    }
  }
  else {
    a_local._4_4_ = do_unstore_file(a,rar,buf,size,offset);
  }
  return a_local._4_4_;
}

Assistant:

static int do_unpack(struct archive_read* a, struct rar5* rar,
    const void** buf, size_t* size, int64_t* offset)
{
	enum COMPRESSION_METHOD {
		STORE = 0, FASTEST = 1, FAST = 2, NORMAL = 3, GOOD = 4,
		BEST = 5
	};

	if(rar->file.service > 0) {
		return do_unstore_file(a, rar, buf, size, offset);
	} else {
		switch(rar->cstate.method) {
			case STORE:
				return do_unstore_file(a, rar, buf, size,
				    offset);
			case FASTEST:
				/* fallthrough */
			case FAST:
				/* fallthrough */
			case NORMAL:
				/* fallthrough */
			case GOOD:
				/* fallthrough */
			case BEST:
				/* No data is returned here. But because a sparse-file aware
				 * caller (like archive_read_data_into_fd) may treat zero-size
				 * as a sparse file block, we need to update the offset
				 * accordingly. At this point the decoder doesn't have any
				 * pending uncompressed data blocks, so the current position in
				 * the output file should be last_write_ptr. */
				if (offset) *offset = rar->cstate.last_write_ptr;
				return uncompress_file(a);
			default:
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Compression method not supported: 0x%x",
				    (unsigned int)rar->cstate.method);

				return ARCHIVE_FATAL;
		}
	}

#if !defined WIN32
	/* Not reached. */
	return ARCHIVE_OK;
#endif
}